

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outputtype.cpp
# Opt level: O3

optional<OutputType> ParseOutputType(string *type)

{
  long lVar1;
  size_t __n;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0x100000000;
  __n = type->_M_string_length;
  if (__n == OUTPUT_TYPE_STRING_LEGACY_abi_cxx11_._M_string_length) {
    if (__n != 0) {
      iVar2 = bcmp((type->_M_dataplus)._M_p,OUTPUT_TYPE_STRING_LEGACY_abi_cxx11_._M_dataplus._M_p,
                   __n);
      if (iVar2 != 0) goto LAB_006c93be;
    }
    uVar4 = 0;
    goto LAB_006c9446;
  }
LAB_006c93be:
  if (__n == OUTPUT_TYPE_STRING_P2SH_SEGWIT_abi_cxx11_._M_string_length) {
    uVar4 = 1;
    if (__n == 0) goto LAB_006c9446;
    iVar2 = bcmp((type->_M_dataplus)._M_p,OUTPUT_TYPE_STRING_P2SH_SEGWIT_abi_cxx11_._M_dataplus._M_p
                 ,__n);
    if (iVar2 == 0) goto LAB_006c9446;
  }
  if (__n == OUTPUT_TYPE_STRING_BECH32_abi_cxx11_._M_string_length) {
    uVar4 = 2;
    if (__n == 0) goto LAB_006c9446;
    iVar2 = bcmp((type->_M_dataplus)._M_p,OUTPUT_TYPE_STRING_BECH32_abi_cxx11_._M_dataplus._M_p,__n)
    ;
    if (iVar2 == 0) goto LAB_006c9446;
  }
  if (__n == OUTPUT_TYPE_STRING_BECH32M_abi_cxx11_._M_string_length) {
    uVar4 = 3;
    if (__n == 0) goto LAB_006c9446;
    iVar2 = bcmp((type->_M_dataplus)._M_p,OUTPUT_TYPE_STRING_BECH32M_abi_cxx11_._M_dataplus._M_p,__n
                );
    if (iVar2 == 0) goto LAB_006c9446;
  }
  uVar4 = 0;
  uVar3 = 0;
LAB_006c9446:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (_Optional_base<OutputType,_true,_true>)
           (_Optional_base<OutputType,_true,_true>)(uVar3 | uVar4);
  }
  __stack_chk_fail();
}

Assistant:

std::optional<OutputType> ParseOutputType(const std::string& type)
{
    if (type == OUTPUT_TYPE_STRING_LEGACY) {
        return OutputType::LEGACY;
    } else if (type == OUTPUT_TYPE_STRING_P2SH_SEGWIT) {
        return OutputType::P2SH_SEGWIT;
    } else if (type == OUTPUT_TYPE_STRING_BECH32) {
        return OutputType::BECH32;
    } else if (type == OUTPUT_TYPE_STRING_BECH32M) {
        return OutputType::BECH32M;
    }
    return std::nullopt;
}